

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall Protocol::MQTT::V5::WillMessage::~WillMessage(WillMessage *this)

{
  WillMessage *this_local;
  
  Common::DynamicBinaryData::~DynamicBinaryData(&this->willPayload);
  Common::DynamicString::~DynamicString(&this->willTopic);
  Properties::~Properties(&this->willProperties);
  Common::Serializable::~Serializable(&this->super_Serializable);
  return;
}

Assistant:

struct WillMessage Final : public Serializable
            {
                /** That's the will properties to attachs to the will message if required */
                Properties          willProperties;
                /** The will topic */
                DynString           willTopic;
                /** The last will application message payload */
                DynBinData          willPayload;

                /** We have a getSize() method that gives the number of bytes requires to serialize this object */
                virtual uint32 getSize() const { return willProperties.getSize() + willTopic.getSize() + willPayload.getSize(); }

                /** Copy the value into the given buffer.
                    @param buffer   A pointer to an allocated buffer that's at least getSize() bytes long
                    @return The number of bytes used in the buffer */
                virtual uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = willProperties.copyInto(buffer);
                    o += willTopic.copyInto(buffer+o);
                    o += willPayload.copyInto(buffer+o);
                    return o;
                }
#if MQTTClientOnlyImplementation != 1
                /** Read the value from a buffer.
                    @param buffer       A pointer to an allocated buffer
                    @param bufLength    The length of the buffer in bytes
                    @return The number of bytes read from the buffer, or a LocalError upon error (use isError() to test for it) */
                virtual uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 s = willProperties.readFrom(buffer, bufLength), o = 0;
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willTopic.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willPayload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s;
                    return o;
                }
#endif

#if MQTTAvoidValidation != 1
                /** Check the will properties validity */
                bool check() const
                {
                    if (!willProperties.check()) return false;
                    PropertyBase * u = willProperties.head;
                    while (u)
                    {   // Will properties are noted as if their control packet type was 0 (since it's reserved, let's use it)
                        if (!isAllowedProperty((PropertyType)u->type, (ControlPacketType)0)) return false;
                        u = u->next;
                    }
                    return willTopic.check() && willPayload.check();
                }
#endif

#if MQTTDumpCommunication == 1
                void dump(MQTTString & out, const int indent = 0) { out += MQTTStringPrintf("%*sWill message\n", (int)indent, ""); willProperties.dump(out, indent + 2); willTopic.dump(out, indent + 2); willPayload.dump(out, indent + 2); }
#endif


                /** Default construction */
                WillMessage() {}
#if HasCPlusPlus11 == 1
                /** Construction for this message */
                WillMessage(DynString && topic, DynBinData && payload, Properties && properties) :
                    willProperties(properties), willTopic(topic), willPayload(payload) {}
#endif

                /** Copy construction */
                WillMessage(const DynString & topic, const DynBinData & payload, const Properties & properties = Properties()) :
                    willProperties(properties), willTopic(topic), willPayload(payload) {}
            }